

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

void __thiscall roaring::Roaring64Map::add(Roaring64Map *this,uint32_t x)

{
  uint in_EAX;
  roaring_bitmap_t *r;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  r = (roaring_bitmap_t *)
      std::
      map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
      ::operator[](&this->roarings,(key_type *)((long)&uStack_18 + 4));
  (r->high_low_container).flags = (r->high_low_container).flags & 0xfe | this->copyOnWrite;
  roaring_bitmap_add(r,x);
  return;
}

Assistant:

void add(uint32_t x) { lookupOrCreateInner(0).add(x); }